

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
* __thiscall
BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::link_leaves(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
              *this,BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                    *previous)

{
  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
  *this_00;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *this_01;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  **ppBVar1;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pBVar2;
  ulong uVar3;
  size_t index;
  size_t index_00;
  
  if (this->subset_size == 0) {
    previous = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  }
  else {
    this_00 = &this->subset;
    ppBVar1 = b_array::
              Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
              ::operator[](this_00,0);
    if ((*ppBVar1)->subset_size == 0) {
      index = 0;
      index_00 = index;
      if (previous ==
          (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
           *)0x0) goto LAB_00104be1;
      ppBVar1 = b_array::
                Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                ::operator[](this_00,0);
      pBVar2 = *ppBVar1;
      while( true ) {
        previous->next = pBVar2;
        index_00 = index;
LAB_00104be1:
        uVar3 = this->subset_size - 1;
        if (uVar3 <= index_00) break;
        index = index_00 + 1;
        ppBVar1 = b_array::
                  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                  ::operator[](this_00,index);
        pBVar2 = *ppBVar1;
        ppBVar1 = b_array::
                  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                  ::operator[](this_00,index_00);
        previous = *ppBVar1;
      }
      ppBVar1 = b_array::
                Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                ::operator[](this_00,uVar3);
      previous = *ppBVar1;
    }
    else {
      uVar3 = 0;
      while (uVar3 < this->subset_size - 1) {
        ppBVar1 = b_array::
                  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                  ::operator[](this_00,uVar3);
        pBVar2 = *ppBVar1;
        uVar3 = uVar3 + 1;
        ppBVar1 = b_array::
                  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                  ::operator[](this_00,uVar3);
        this_01 = *ppBVar1;
        pBVar2 = link_leaves(pBVar2,previous);
        previous = link_leaves(this_01,pBVar2);
      }
    }
  }
  return previous;
}

Assistant:

bool is_leaf() const { return subset_size == 0; }